

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O1

void __thiscall
phosg::BitmapImage::BitmapImage(BitmapImage *this,char *filename,size_t width,size_t height)

{
  uint8_t *__s;
  ulong uVar1;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  allocator<char> local_69;
  code *local_68;
  FILE *local_60;
  string local_58;
  string local_38;
  
  this->width = width;
  this->height = height;
  uVar1 = width + 7 >> 3;
  this->row_bytes = uVar1;
  uVar1 = uVar1 * height;
  __s = (uint8_t *)operator_new__(uVar1);
  this->data = __s;
  memset(__s,0,uVar1);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,filename,&local_69);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"rb","");
  fopen_unique((phosg *)&local_68,&local_38,&local_58,(FILE *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  freadx(local_60,this->data,this->row_bytes * this->height);
  if (local_60 != (FILE *)0x0) {
    (*local_68)();
  }
  return;
}

Assistant:

BitmapImage::BitmapImage(const char* filename, size_t width, size_t height)
    : BitmapImage(width, height) {
  auto f = fopen_unique(filename, "rb");
  freadx(f.get(), this->data, this->get_data_size());
}